

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

pointer __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::Node>
::allocate(MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::Node>
           *this,size_type n,void *param_2)

{
  Arena *this_00;
  pointer pvVar1;
  ulong n_00;
  
  this_00 = this->arena_;
  n_00 = n << 5;
  if (this_00 != (Arena *)0x0) {
    if (this_00->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation(this_00,(type_info *)&unsigned_char::typeinfo,n_00);
    }
    pvVar1 = (pointer)internal::ArenaImpl::AllocateAligned(&this_00->impl_,n_00);
    return pvVar1;
  }
  pvVar1 = (pointer)operator_new(n_00);
  return pvVar1;
}

Assistant:

pointer allocate(size_type n, const void* /* hint */ = 0) {
      // If arena is not given, malloc needs to be called which doesn't
      // construct element object.
      if (arena_ == NULL) {
        return static_cast<pointer>(::operator new(n * sizeof(value_type)));
      } else {
        return reinterpret_cast<pointer>(
            Arena::CreateArray<uint8>(arena_, n * sizeof(value_type)));
      }
    }